

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msd.c
# Opt level: O0

list MSD1(list a,int n)

{
  boolean bVar1;
  stack *psVar2;
  stack *s;
  list res;
  int n_local;
  list a_local;
  
  s = (stack *)0x0;
  a_local = a;
  if (1 < n) {
    initmem(stackmem,0x18,n / 0x32);
    push(a,(list)0x0,n,0);
    while (bVar1 = stackempty(), bVar1 == 0) {
      psVar2 = pop();
      if (psVar2->size == 0) {
        psVar2->tail->next = (list)s;
        s = (stack *)psVar2->head;
      }
      else {
        bucketing(psVar2->head,psVar2->pos);
      }
    }
    freemem(stackmem);
    a_local = (list)s;
  }
  return a_local;
}

Assistant:

list MSD1(list a, int n)
{
   list res = NULL;
   stack *s;

   if (n < 2) return a;
   initmem(stackmem, sizeof(struct stackrec), n/50);
   push(a, NULL, n, 0);

   while (!stackempty()) {
      s = pop();
      if (!s->size) {   /* sorted */
         s->tail->next = res;
         res = s->head;
         continue;
      }
      bucketing(s->head, s->pos);
   }

   freemem(stackmem);
   return res;
}